

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

void __thiscall
embree::BVHNStatistics<4>::Statistics::Statistics
          (Statistics *this,size_t depth,LeafStat statLeaf,
          NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes,
          NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes,
          NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB,
          NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D,
          NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB,
          NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes)

{
  long lVar1;
  LeafStat *pLVar2;
  LeafStat *pLVar3;
  
  this->depth = depth;
  pLVar2 = &statLeaf;
  pLVar3 = &this->statLeaf;
  for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
    pLVar3->leafSAH = pLVar2->leafSAH;
    pLVar2 = (LeafStat *)&pLVar2->numLeaves;
    pLVar3 = (LeafStat *)&pLVar3->numLeaves;
  }
  (this->statAABBNodes).numChildren = statAABBNodes.numChildren;
  (this->statAABBNodes).nodeSAH = statAABBNodes.nodeSAH;
  (this->statAABBNodes).numNodes = statAABBNodes.numNodes;
  (this->statOBBNodes).numChildren = statOBBNodes.numChildren;
  (this->statOBBNodes).nodeSAH = statOBBNodes.nodeSAH;
  (this->statOBBNodes).numNodes = statOBBNodes.numNodes;
  (this->statAABBNodesMB).numChildren = statAABBNodesMB.numChildren;
  (this->statAABBNodesMB).nodeSAH = statAABBNodesMB.nodeSAH;
  (this->statAABBNodesMB).numNodes = statAABBNodesMB.numNodes;
  (this->statAABBNodesMB4D).numChildren = statAABBNodesMB4D.numChildren;
  (this->statAABBNodesMB4D).nodeSAH = statAABBNodesMB4D.nodeSAH;
  (this->statAABBNodesMB4D).numNodes = statAABBNodesMB4D.numNodes;
  (this->statOBBNodesMB).nodeSAH = statOBBNodesMB.nodeSAH;
  (this->statOBBNodesMB).numNodes = statOBBNodesMB.numNodes;
  (this->statOBBNodesMB).numChildren = statOBBNodesMB.numChildren;
  (this->statQuantizedNodes).nodeSAH = statQuantizedNodes.nodeSAH;
  (this->statQuantizedNodes).numNodes = statQuantizedNodes.numNodes;
  (this->statQuantizedNodes).numChildren = statQuantizedNodes.numChildren;
  return;
}

Assistant:

Statistics (size_t depth = 0,
                  LeafStat statLeaf = LeafStat(),
                  NodeStat<AABBNode> statAABBNodes = NodeStat<AABBNode>(),
                  NodeStat<OBBNode> statOBBNodes = NodeStat<OBBNode>(),
                  NodeStat<AABBNodeMB> statAABBNodesMB = NodeStat<AABBNodeMB>(),
                  NodeStat<AABBNodeMB4D> statAABBNodesMB4D = NodeStat<AABBNodeMB4D>(),
                  NodeStat<OBBNodeMB> statOBBNodesMB = NodeStat<OBBNodeMB>(),
                  NodeStat<QuantizedNode> statQuantizedNodes = NodeStat<QuantizedNode>())

      : depth(depth), 
        statLeaf(statLeaf),
        statAABBNodes(statAABBNodes),
        statOBBNodes(statOBBNodes),
        statAABBNodesMB(statAABBNodesMB),
        statAABBNodesMB4D(statAABBNodesMB4D),
        statOBBNodesMB(statOBBNodesMB),
        statQuantizedNodes(statQuantizedNodes) {}